

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O1

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrLocalizationEnableEventsInfoML *value
               ,string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  byte bVar1;
  XrStructureType XVar2;
  pointer pcVar3;
  PFN_xrStructureTypeToString p_Var4;
  void *value_00;
  XrStructureType __val;
  uint uVar5;
  bool bVar6;
  char *pcVar7;
  XrInstance pXVar8;
  invalid_argument *this;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  uint __len;
  string type_prefix;
  string next_prefix;
  string enabled_prefix;
  ostringstream oss_enabled;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  XrLocalizationEnableEventsInfoML *local_230;
  long *local_228;
  long local_220;
  long local_218 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  ios_base local_138 [264];
  
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  local_250._M_dataplus._M_p = (pointer)value;
  std::__cxx11::string::_M_construct((ulong)&local_1a8,'\x12');
  *local_1a8._M_dataplus._M_p = '0';
  local_1a8._M_dataplus._M_p[1] = 'x';
  pcVar7 = local_1a8._M_dataplus._M_p + (local_1a8._M_string_length - 1);
  lVar10 = 0;
  do {
    bVar1 = *(byte *)((long)&local_250._M_dataplus._M_p + lVar10);
    *pcVar7 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar1 & 0xf];
    pcVar7[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar1 >> 4];
    lVar10 = lVar10 + 1;
    pcVar7 = pcVar7 + -2;
  } while (lVar10 != 8);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,&local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)prefix);
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  pcVar3 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_250,pcVar3,pcVar3 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_250);
  local_230 = value;
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    XVar2 = value->type;
    __val = -XVar2;
    if (0 < (int)XVar2) {
      __val = XVar2;
    }
    __len = 1;
    if (XR_TYPE_SWAPCHAIN_CREATE_INFO < __val) {
      uVar11 = (ulong)__val;
      uVar5 = 4;
      do {
        __len = uVar5;
        uVar9 = (uint)uVar11;
        if (uVar9 < 100) {
          __len = __len - 2;
          goto LAB_001ac84d;
        }
        if (uVar9 < 1000) {
          __len = __len - 1;
          goto LAB_001ac84d;
        }
        if (uVar9 < 10000) goto LAB_001ac84d;
        uVar11 = uVar11 / 10000;
        uVar5 = __len + 4;
      } while (99999 < uVar9);
      __len = __len + 1;
    }
LAB_001ac84d:
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_1a8,(char)__len - (char)((int)XVar2 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_1a8._M_dataplus._M_p + (XVar2 >> 0x1f),__len,__val);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_250,&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_178 = 0;
    uStack_170 = 0;
    local_188 = 0;
    uStack_180 = 0;
    local_1a8.field_2._M_allocated_capacity = 0;
    local_1a8.field_2._8_8_ = 0;
    local_1a8._M_dataplus._M_p = (pointer)0x0;
    local_1a8._M_string_length = 0;
    p_Var4 = gen_dispatch_table->StructureTypeToString;
    pXVar8 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var4)(pXVar8,value->type,(char *)&local_1a8);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_250,(char (*) [64])&local_1a8);
  }
  pcVar3 = (prefix->_M_dataplus)._M_p;
  local_228 = local_218;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_228,pcVar3,pcVar3 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_228);
  value_00 = local_230->next;
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,local_228,local_220 + (long)local_228);
  bVar6 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_1e8,contents);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if (bVar6) {
    pcVar3 = (prefix->_M_dataplus)._M_p;
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_208,pcVar3,pcVar3 + prefix->_M_string_length);
    std::__cxx11::string::append((char *)&local_208);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"0x",2);
    *(uint *)((long)&local_1a8.field_2 + *(long *)(local_1a8._M_dataplus._M_p + -0x18) + 8) =
         *(uint *)((long)&local_1a8.field_2 + *(long *)(local_1a8._M_dataplus._M_p + -0x18) + 8) &
         0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"XrBool32",&local_208,&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if (local_228 != local_218) {
      operator_delete(local_228,local_218[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    return true;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Invalid Operation");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrLocalizationEnableEventsInfoML* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string enabled_prefix = prefix;
        enabled_prefix += "enabled";
        std::ostringstream oss_enabled;
        oss_enabled << "0x" << std::hex << (value->enabled);
        contents.emplace_back("XrBool32", enabled_prefix, oss_enabled.str());
        return true;
    } catch(...) {
    }
    return false;
}